

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

void tcd_malloc_decode_tile
               (opj_tcd_t *tcd,opj_image_t *image,opj_cp_t *cp,int tileno,
               opj_codestream_info_t *cstr_info)

{
  long lVar1;
  opj_tcd_band_t *poVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  opj_tcp_t *poVar8;
  opj_image_comp_t *poVar9;
  opj_tcd_resolution_t *poVar10;
  ulong uVar11;
  OPJ_UINT32 OVar12;
  OPJ_UINT32 OVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  opj_tcd_resolution_t *poVar17;
  opj_tcd_precinct_t *poVar18;
  opj_tcd_cblk_enc_t *poVar19;
  opj_tgt_tree_t *poVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  OPJ_UINT32 OVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  opj_tcd_tile_t *poVar37;
  long lVar38;
  uint uVar39;
  opj_tcd_tilecomp_t *poVar40;
  OPJ_UINT32 OVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  opj_tccp_t *poVar45;
  uint uVar47;
  double dVar46;
  uint uVar48;
  uint uVar49;
  undefined1 auVar50 [16];
  uint local_d8;
  uint local_d4;
  int local_70;
  
  tcd->cp = cp;
  iVar4 = cp->tileno[tileno];
  poVar37 = tcd->tcd_image->tiles;
  if (0 < poVar37[iVar4].numcomps) {
    poVar37 = poVar37 + iVar4;
    poVar8 = cp->tcps;
    lVar38 = 0;
    do {
      poVar45 = poVar8[iVar4].tccps;
      poVar40 = poVar37->comps;
      poVar9 = image->comps;
      OVar30 = poVar9[lVar38].dx;
      poVar40[lVar38].x0 = (int)(poVar37->x0 + (OVar30 - 1)) / (int)OVar30;
      OVar41 = poVar9[lVar38].dy;
      poVar40[lVar38].y0 = (int)(poVar37->y0 + (OVar41 - 1)) / (int)OVar41;
      poVar40[lVar38].x1 = (int)((OVar30 - 1) + poVar37->x1) / (int)OVar30;
      poVar40[lVar38].y1 = (int)((OVar41 - 1) + poVar37->y1) / (int)OVar41;
      OVar30 = poVar45[lVar38].numresolutions;
      lVar43 = (long)(int)OVar30;
      poVar40[lVar38].numresolutions = OVar30;
      poVar17 = (opj_tcd_resolution_t *)malloc(lVar43 * 0x98);
      poVar40[lVar38].resolutions = poVar17;
      if (0 < lVar43) {
        poVar45 = poVar45 + lVar38;
        poVar40 = poVar40 + lVar38;
        lVar44 = 0;
        do {
          uVar26 = ~(uint)lVar44 + (int)lVar43;
          bVar21 = (byte)uVar26;
          iVar27 = 1 << (bVar21 & 0x1f);
          poVar10 = poVar40->resolutions;
          auVar50 = ZEXT416(uVar26);
          uVar26 = iVar27 + poVar40->x0 + -1 >> auVar50;
          uVar47 = iVar27 + poVar40->y0 + -1 >> auVar50;
          uVar48 = iVar27 + poVar40->x1 + -1 >> auVar50;
          uVar49 = iVar27 + poVar40->y1 + -1 >> auVar50;
          poVar17 = poVar10 + lVar44;
          poVar17->x0 = uVar26;
          poVar17->y0 = uVar47;
          poVar17->x1 = uVar48;
          poVar17->y1 = uVar49;
          poVar10[lVar44].numbands = (uint)(lVar44 != 0) * 2 + 1;
          OVar41 = 0xf;
          OVar30 = 0xf;
          if ((poVar45->csty & 1) != 0) {
            OVar30 = poVar45->prcw[lVar44];
            OVar41 = poVar45->prch[lVar44];
          }
          bVar23 = (byte)OVar30;
          uVar39 = -1 << (bVar23 & 0x1f);
          bVar22 = (byte)OVar41;
          uVar33 = -1 << (bVar22 & 0x1f);
          local_d4 = uVar39 & uVar26;
          local_d8 = uVar33 & uVar47;
          iVar14 = (int)((((1 << (bVar23 & 0x1f)) + uVar48) - 1 & uVar39) - local_d4) >>
                   (bVar23 & 0x1f);
          if (uVar26 == uVar48) {
            iVar14 = 0;
          }
          iVar15 = (int)((((1 << (bVar22 & 0x1f)) + uVar49) - 1 & uVar33) - local_d8) >>
                   (bVar22 & 0x1f);
          if (uVar47 == uVar49) {
            iVar15 = 0;
          }
          poVar10[lVar44].pw = iVar14;
          poVar10[lVar44].ph = iVar15;
          if (lVar44 != 0) {
            local_d4 = (int)(local_d4 + 1) >> 1;
            local_d8 = (int)(local_d8 + 1) >> 1;
            OVar30 = OVar30 - 1;
            OVar41 = OVar41 - 1;
          }
          OVar12 = poVar45->cblkw;
          if ((int)OVar30 <= (int)poVar45->cblkw) {
            OVar12 = OVar30;
          }
          OVar13 = poVar45->cblkh;
          if ((int)OVar41 <= (int)poVar45->cblkh) {
            OVar13 = OVar41;
          }
          if (0 < poVar10[lVar44].numbands) {
            bVar23 = (char)lVar43 - (char)lVar44;
            iVar14 = 1 << (bVar23 & 0x1f);
            iVar27 = iVar27 + -1;
            bVar22 = (byte)OVar12;
            bVar24 = (byte)OVar13;
            local_70 = (uint)lVar44 * 3 + -2;
            lVar43 = 0;
            do {
              lVar1 = lVar43 + 1;
              poVar2 = poVar10[lVar44].bands + lVar43;
              iVar15 = (int)lVar1;
              if (lVar44 == 0) {
                iVar15 = 0;
              }
              poVar2->bandno = iVar15;
              if (lVar44 == 0) {
                poVar2->x0 = poVar40->x0 + iVar27 >> (bVar21 & 0x1f);
                poVar2->y0 = poVar40->y0 + iVar27 >> (bVar21 & 0x1f);
                poVar2->x1 = poVar40->x1 + iVar27 >> (bVar21 & 0x1f);
                iVar28 = poVar40->y1 + iVar27;
                bVar25 = bVar21;
              }
              else {
                uVar26 = (uint)(iVar15 == 3);
                uVar47 = uVar26;
                if (iVar15 == 2) {
                  uVar47 = 1;
                }
                if (iVar15 == 1) {
                  uVar26 = 1;
                }
                iVar34 = ~(uVar26 << (bVar21 & 0x1f)) + iVar14;
                poVar2->x0 = poVar40->x0 + iVar34 >> (bVar23 & 0x1f);
                iVar28 = ~(uVar47 << (bVar21 & 0x1f)) + iVar14;
                poVar2->y0 = poVar40->y0 + iVar28 >> (bVar23 & 0x1f);
                poVar2->x1 = iVar34 + poVar40->x1 >> (bVar23 & 0x1f);
                iVar28 = iVar28 + poVar40->y1;
                bVar25 = bVar23;
              }
              poVar2->y1 = iVar28 >> (bVar25 & 0x1f);
              lVar43 = (long)((int)lVar43 + local_70);
              if (lVar44 == 0) {
                lVar43 = 0;
              }
              if (poVar45->qmfbid == 0) {
                iVar15 = dwt_getgain_real(iVar15);
              }
              else {
                iVar15 = dwt_getgain(iVar15);
              }
              iVar28 = poVar45->stepsizes[lVar43].mant;
              iVar34 = poVar45->stepsizes[lVar43].expn;
              dVar46 = ldexp(1.0,(iVar15 + image->comps[lVar38].prec) - iVar34);
              poVar2->stepsize = (float)(dVar46 * 0.5 * ((double)iVar28 * 0.00048828125 + 1.0));
              poVar2->numbps = iVar34 + -1 + poVar45->numgbits;
              poVar18 = (opj_tcd_precinct_t *)
                        malloc((long)poVar10[lVar44].ph * (long)poVar10[lVar44].pw * 0x30);
              poVar2->precincts = poVar18;
              uVar35 = (ulong)(uint)poVar10[lVar44].pw;
              if (0 < poVar10[lVar44].ph * poVar10[lVar44].pw) {
                uVar36 = 0;
                do {
                  uVar11 = (ulong)(uint)((int)uVar36 >> 0x1f) << 0x20 | uVar36 & 0xffffffff;
                  iVar31 = (int)((long)uVar11 % (long)(int)uVar35);
                  iVar15 = (int)((long)uVar11 / (long)(int)uVar35);
                  iVar28 = (iVar31 << ((byte)OVar30 & 0x1f)) + local_d4;
                  iVar34 = (iVar15 << ((byte)OVar41 & 0x1f)) + local_d8;
                  iVar31 = (iVar31 + 1 << ((byte)OVar30 & 0x1f)) + local_d4;
                  iVar15 = (iVar15 + 1 << ((byte)OVar41 & 0x1f)) + local_d8;
                  poVar18 = poVar2->precincts;
                  if (iVar28 <= poVar2->x0) {
                    iVar28 = poVar2->x0;
                  }
                  poVar18[uVar36].x0 = iVar28;
                  if (iVar34 <= poVar2->y0) {
                    iVar34 = poVar2->y0;
                  }
                  poVar18[uVar36].y0 = iVar34;
                  if (poVar2->x1 <= iVar31) {
                    iVar31 = poVar2->x1;
                  }
                  poVar18[uVar36].x1 = iVar31;
                  if (poVar2->y1 <= iVar15) {
                    iVar15 = poVar2->y1;
                  }
                  iVar28 = iVar28 >> (bVar22 & 0x1f);
                  iVar34 = iVar34 >> (bVar24 & 0x1f);
                  poVar18[uVar36].y1 = iVar15;
                  iVar31 = ((iVar31 + ~(-1 << (bVar22 & 0x1f)) >> (bVar22 & 0x1f)) - iVar28 <<
                           (bVar22 & 0x1f)) >> (bVar22 & 0x1f);
                  poVar18[uVar36].cw = iVar31;
                  iVar15 = ((iVar15 + ~(-1 << (bVar24 & 0x1f)) >> (bVar24 & 0x1f)) - iVar34 <<
                           (bVar24 & 0x1f)) >> (bVar24 & 0x1f);
                  poVar18[uVar36].ch = iVar15;
                  poVar19 = (opj_tcd_cblk_enc_t *)malloc((long)(iVar15 * iVar31) * 0x38);
                  poVar18[uVar36].cblks.enc = poVar19;
                  poVar20 = tgt_create(iVar31,iVar15);
                  poVar18[uVar36].incltree = poVar20;
                  poVar20 = tgt_create(poVar18[uVar36].cw,poVar18[uVar36].ch);
                  poVar18[uVar36].imsbtree = poVar20;
                  iVar15 = poVar18[uVar36].cw;
                  uVar26 = poVar18[uVar36].ch * iVar15;
                  if (0 < (int)uVar26) {
                    poVar18 = poVar18 + uVar36;
                    iVar31 = poVar18->x0;
                    iVar5 = poVar18->y0;
                    iVar6 = poVar18->x1;
                    iVar7 = poVar18->y1;
                    lVar43 = 0x30;
                    uVar35 = 0;
                    do {
                      uVar11 = (ulong)(uint)((int)uVar35 >> 0x1f) << 0x20 | uVar35 & 0xffffffff;
                      iVar16 = (int)((long)uVar11 / (long)iVar15);
                      iVar29 = (int)((long)uVar11 % (long)iVar15);
                      iVar32 = iVar29 + iVar28 << (bVar22 & 0x1f);
                      iVar42 = iVar16 + iVar34 << (bVar24 & 0x1f);
                      iVar29 = iVar29 + iVar28 + 1 << (bVar22 & 0x1f);
                      iVar16 = iVar16 + iVar34 + 1 << (bVar24 & 0x1f);
                      poVar19 = (poVar18->cblks).enc;
                      if (iVar32 <= iVar31) {
                        iVar32 = iVar31;
                      }
                      puVar3 = (undefined8 *)((long)poVar19 + lVar43 + -0x30);
                      *puVar3 = 0;
                      puVar3[1] = 0;
                      *(int *)((long)poVar19 + lVar43 + -0x20) = iVar32;
                      if (iVar42 <= iVar5) {
                        iVar42 = iVar5;
                      }
                      *(int *)((long)poVar19 + lVar43 + -0x1c) = iVar42;
                      if (iVar6 <= iVar29) {
                        iVar29 = iVar6;
                      }
                      *(int *)((long)poVar19 + lVar43 + -0x18) = iVar29;
                      if (iVar7 <= iVar16) {
                        iVar16 = iVar7;
                      }
                      *(int *)((long)poVar19 + lVar43 + -0x14) = iVar16;
                      *(undefined4 *)((long)&poVar19->data + lVar43) = 0;
                      uVar35 = uVar35 + 1;
                      lVar43 = lVar43 + 0x38;
                    } while (uVar26 != uVar35);
                  }
                  uVar36 = uVar36 + 1;
                  uVar35 = (ulong)poVar10[lVar44].pw;
                } while ((long)uVar36 < (long)((long)poVar10[lVar44].ph * uVar35));
              }
              lVar43 = lVar1;
            } while (lVar1 < poVar10[lVar44].numbands);
          }
          lVar44 = lVar44 + 1;
          lVar43 = (long)poVar40->numresolutions;
        } while (lVar44 < lVar43);
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 < poVar37->numcomps);
  }
  return;
}

Assistant:

void tcd_malloc_decode_tile(opj_tcd_t *tcd, opj_image_t * image, opj_cp_t * cp, int tileno, opj_codestream_info_t *cstr_info) {
	int compno, resno, bandno, precno, cblkno;
	opj_tcp_t *tcp;
	opj_tcd_tile_t *tile;

	OPJ_ARG_NOT_USED(cstr_info);

	tcd->cp = cp;
	
	tcp = &(cp->tcps[cp->tileno[tileno]]);
	tile = &(tcd->tcd_image->tiles[cp->tileno[tileno]]);
	
	tileno = cp->tileno[tileno];
	
	for (compno = 0; compno < tile->numcomps; compno++) {
		opj_tccp_t *tccp = &tcp->tccps[compno];
		opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
		
		/* border of each tile component (global) */
		tilec->x0 = int_ceildiv(tile->x0, image->comps[compno].dx);
		tilec->y0 = int_ceildiv(tile->y0, image->comps[compno].dy);
		tilec->x1 = int_ceildiv(tile->x1, image->comps[compno].dx);
		tilec->y1 = int_ceildiv(tile->y1, image->comps[compno].dy);

		tilec->numresolutions = tccp->numresolutions;
		tilec->resolutions = (opj_tcd_resolution_t *) opj_malloc(tilec->numresolutions * sizeof(opj_tcd_resolution_t));
		
		for (resno = 0; resno < tilec->numresolutions; resno++) {
			int pdx, pdy;
			int levelno = tilec->numresolutions - 1 - resno;
			int tlprcxstart, tlprcystart, brprcxend, brprcyend;
			int tlcbgxstart, tlcbgystart, brcbgxend, brcbgyend;
			int cbgwidthexpn, cbgheightexpn;
			int cblkwidthexpn, cblkheightexpn;
			
			opj_tcd_resolution_t *res = &tilec->resolutions[resno];
			
			/* border for each resolution level (global) */
			res->x0 = int_ceildivpow2(tilec->x0, levelno);
			res->y0 = int_ceildivpow2(tilec->y0, levelno);
			res->x1 = int_ceildivpow2(tilec->x1, levelno);
			res->y1 = int_ceildivpow2(tilec->y1, levelno);
			res->numbands = resno == 0 ? 1 : 3;
			
			/* p. 35, table A-23, ISO/IEC FDIS154444-1 : 2000 (18 august 2000) */
			if (tccp->csty & J2K_CCP_CSTY_PRT) {
				pdx = tccp->prcw[resno];
				pdy = tccp->prch[resno];
			} else {
				pdx = 15;
				pdy = 15;
			}			
			
			/* p. 64, B.6, ISO/IEC FDIS15444-1 : 2000 (18 august 2000)  */
			tlprcxstart = int_floordivpow2(res->x0, pdx) << pdx;
			tlprcystart = int_floordivpow2(res->y0, pdy) << pdy;
			brprcxend = int_ceildivpow2(res->x1, pdx) << pdx;
			brprcyend = int_ceildivpow2(res->y1, pdy) << pdy;
			
			res->pw = (res->x0 == res->x1) ? 0 : ((brprcxend - tlprcxstart) >> pdx);
			res->ph = (res->y0 == res->y1) ? 0 : ((brprcyend - tlprcystart) >> pdy);
			
			if (resno == 0) {
				tlcbgxstart = tlprcxstart;
				tlcbgystart = tlprcystart;
				brcbgxend = brprcxend;
				brcbgyend = brprcyend;
				cbgwidthexpn = pdx;
				cbgheightexpn = pdy;
			} else {
				tlcbgxstart = int_ceildivpow2(tlprcxstart, 1);
				tlcbgystart = int_ceildivpow2(tlprcystart, 1);
				brcbgxend = int_ceildivpow2(brprcxend, 1);
				brcbgyend = int_ceildivpow2(brprcyend, 1);
				cbgwidthexpn = pdx - 1;
				cbgheightexpn = pdy - 1;
			}
			
			cblkwidthexpn = int_min(tccp->cblkw, cbgwidthexpn);
			cblkheightexpn = int_min(tccp->cblkh, cbgheightexpn);
			
			for (bandno = 0; bandno < res->numbands; bandno++) {
				int x0b, y0b;
				int gain, numbps;
				opj_stepsize_t *ss = NULL;
				
				opj_tcd_band_t *band = &res->bands[bandno];
				band->bandno = resno == 0 ? 0 : bandno + 1;
				x0b = (band->bandno == 1) || (band->bandno == 3) ? 1 : 0;
				y0b = (band->bandno == 2) || (band->bandno == 3) ? 1 : 0;
				
				if (band->bandno == 0) {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0, levelno);
					band->y0 = int_ceildivpow2(tilec->y0, levelno);
					band->x1 = int_ceildivpow2(tilec->x1, levelno);
					band->y1 = int_ceildivpow2(tilec->y1, levelno);
				} else {
					/* band border (global) */
					band->x0 = int_ceildivpow2(tilec->x0 - (1 << levelno) * x0b, levelno + 1);
					band->y0 = int_ceildivpow2(tilec->y0 - (1 << levelno) * y0b, levelno + 1);
					band->x1 = int_ceildivpow2(tilec->x1 - (1 << levelno) * x0b, levelno + 1);
					band->y1 = int_ceildivpow2(tilec->y1 - (1 << levelno) * y0b, levelno + 1);
				}
				
				ss = &tccp->stepsizes[resno == 0 ? 0 : 3 * (resno - 1) + bandno + 1];
				gain = tccp->qmfbid == 0 ? dwt_getgain_real(band->bandno) : dwt_getgain(band->bandno);
				numbps = image->comps[compno].prec + gain;
				band->stepsize = (float)(((1.0 + ss->mant / 2048.0) * pow(2.0, numbps - ss->expn)) * 0.5);
				band->numbps = ss->expn + tccp->numgbits - 1;	/* WHY -1 ? */
				
				band->precincts = (opj_tcd_precinct_t *) opj_malloc(res->pw * res->ph * sizeof(opj_tcd_precinct_t));
				
				for (precno = 0; precno < res->pw * res->ph; precno++) {
					int tlcblkxstart, tlcblkystart, brcblkxend, brcblkyend;
					int cbgxstart = tlcbgxstart + (precno % res->pw) * (1 << cbgwidthexpn);
					int cbgystart = tlcbgystart + (precno / res->pw) * (1 << cbgheightexpn);
					int cbgxend = cbgxstart + (1 << cbgwidthexpn);
					int cbgyend = cbgystart + (1 << cbgheightexpn);
					
					opj_tcd_precinct_t *prc = &band->precincts[precno];
					/* precinct size (global) */
					prc->x0 = int_max(cbgxstart, band->x0);
					prc->y0 = int_max(cbgystart, band->y0);
					prc->x1 = int_min(cbgxend, band->x1);
					prc->y1 = int_min(cbgyend, band->y1);
					
					tlcblkxstart = int_floordivpow2(prc->x0, cblkwidthexpn) << cblkwidthexpn;
					tlcblkystart = int_floordivpow2(prc->y0, cblkheightexpn) << cblkheightexpn;
					brcblkxend = int_ceildivpow2(prc->x1, cblkwidthexpn) << cblkwidthexpn;
					brcblkyend = int_ceildivpow2(prc->y1, cblkheightexpn) << cblkheightexpn;
					prc->cw = (brcblkxend - tlcblkxstart) >> cblkwidthexpn;
					prc->ch = (brcblkyend - tlcblkystart) >> cblkheightexpn;

					prc->cblks.dec = (opj_tcd_cblk_dec_t*) opj_malloc(prc->cw * prc->ch * sizeof(opj_tcd_cblk_dec_t));

					prc->incltree = tgt_create(prc->cw, prc->ch);
					prc->imsbtree = tgt_create(prc->cw, prc->ch);
					
					for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
						int cblkxstart = tlcblkxstart + (cblkno % prc->cw) * (1 << cblkwidthexpn);
						int cblkystart = tlcblkystart + (cblkno / prc->cw) * (1 << cblkheightexpn);
						int cblkxend = cblkxstart + (1 << cblkwidthexpn);
						int cblkyend = cblkystart + (1 << cblkheightexpn);					

						opj_tcd_cblk_dec_t* cblk = &prc->cblks.dec[cblkno];
						cblk->data = NULL;
						cblk->segs = NULL;
						/* code-block size (global) */
						cblk->x0 = int_max(cblkxstart, prc->x0);
						cblk->y0 = int_max(cblkystart, prc->y0);
						cblk->x1 = int_min(cblkxend, prc->x1);
						cblk->y1 = int_min(cblkyend, prc->y1);
						cblk->numsegs = 0;
					}
				} /* precno */
			} /* bandno */
		} /* resno */
	} /* compno */
	/* tcd_dump(stdout, tcd, &tcd->tcd_image); */
}